

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

char * basic_get(amqp_connection_state_t connection_state_,char *queue_name_,
                uint64_t *out_body_size_)

{
  uint __line;
  int iVar1;
  char *pcVar2;
  amqp_bytes_t queue;
  amqp_time_t deadline;
  timeval timeout;
  amqp_rpc_reply_t local_160;
  amqp_message_t message;
  
  timeout.tv_sec = 5;
  timeout.tv_usec = 0;
  iVar1 = amqp_time_from_now(&deadline,&timeout);
  if (iVar1 == 0) {
    do {
      queue = amqp_cstring_bytes(queue_name_);
      amqp_basic_get((amqp_rpc_reply_t *)&message,connection_state_,1,queue,1);
      if ((message.properties._flags != 1) || ((int)message.properties.content_type.len != 0x3c0048)
         ) {
        if (message.properties._flags != 1) {
          pcVar2 = "rpc_reply.reply_type == AMQP_RESPONSE_NORMAL";
          __line = 0x68;
          goto LAB_0010263a;
        }
        if ((int)message.properties.content_type.len == 0x3c0047) {
          amqp_read_message(&local_160,connection_state_,1,&message,0);
          if (local_160.reply_type == AMQP_RESPONSE_NORMAL) {
            pcVar2 = (char *)malloc(message.body.len);
            memcpy(pcVar2,message.body.bytes,message.body.len);
            *out_body_size_ = message.body.len;
            amqp_destroy_message(&message);
            return pcVar2;
          }
          pcVar2 = "rpc_reply.reply_type == AMQP_RESPONSE_NORMAL";
          __line = 0x6e;
          goto LAB_0010263a;
        }
        break;
      }
      iVar1 = amqp_time_has_past(deadline);
    } while (iVar1 == 0);
    pcVar2 = "rpc_reply.reply.id == AMQP_BASIC_GET_OK_METHOD";
    __line = 0x69;
  }
  else {
    pcVar2 = "time_rc == AMQP_STATUS_OK";
    __line = 0x5f;
  }
LAB_0010263a:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,__line,"char *basic_get(amqp_connection_state_t, const char *, uint64_t *)");
}

Assistant:

char *basic_get(amqp_connection_state_t connection_state_,
                const char *queue_name_, uint64_t *out_body_size_) {
  amqp_rpc_reply_t rpc_reply;
  amqp_time_t deadline;
  struct timeval timeout = {5, 0};
  int time_rc = amqp_time_from_now(&deadline, &timeout);
  assert(time_rc == AMQP_STATUS_OK);

  do {
    rpc_reply = amqp_basic_get(connection_state_, fixed_channel_id,
                               amqp_cstring_bytes(queue_name_), /*no_ack*/ 1);
  } while (rpc_reply.reply_type == AMQP_RESPONSE_NORMAL &&
           rpc_reply.reply.id == AMQP_BASIC_GET_EMPTY_METHOD &&
           amqp_time_has_past(deadline) == AMQP_STATUS_OK);

  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);
  assert(rpc_reply.reply.id == AMQP_BASIC_GET_OK_METHOD);

  amqp_message_t message;
  rpc_reply =
      amqp_read_message(connection_state_, fixed_channel_id, &message, 0);
  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);

  char *body = malloc(message.body.len);
  memcpy(body, message.body.bytes, message.body.len);
  *out_body_size_ = message.body.len;
  amqp_destroy_message(&message);

  return body;
}